

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::ExtractChannel
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t channelId)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint8_t colorCount;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  uchar *local_48;
  uint32_t in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8
            );
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  uVar2 = (uint)in_stack_00000018;
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
  if ((int)(uint)bVar1 <= (int)uVar2) {
    uVar5 = __cxa_allocate_exception(0x28);
    imageException::imageException
              ((imageException *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar5,&imageException::typeinfo,imageException::~imageException);
  }
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  puVar6 = puVar6 + (long)(int)(uint)in_stack_00000018 +
                    (ulong)(in_ESI * (uint)bVar1) + (ulong)(in_EDX * uVar3);
  local_48 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  local_48 = local_48 + (ulong)in_R8D + (ulong)(in_R9D * uVar4);
  puVar7 = local_48 + in_stack_00000010 * uVar4;
  for (; local_48 != puVar7; local_48 = local_48 + uVar4) {
    puVar9 = puVar6;
    for (puVar8 = local_48; puVar8 != local_48 + in_stack_00000008; puVar8 = puVar8 + 1) {
      *puVar8 = *puVar9;
      puVar9 = puVar9 + (int)(uint)bVar1;
    }
    puVar6 = puVar6 + uVar3;
  }
  return;
}

Assistant:

void ExtractChannel( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut,
                         uint32_t startYOut, uint32_t width, uint32_t height, uint8_t channelId )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( out );

        if( channelId >= in.colorCount() )
            throw imageException( "Channel ID for color image is greater than channel count in input image" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = in.colorCount();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn * colorCount + channelId;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, inX += colorCount )
                (*outX) = *(inX);
        }
    }